

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-trapezoid-tessellator.cpp
# Opt level: O0

Segment * __thiscall
gepard::Segment::splitSegment(Segment *__return_storage_ptr__,Segment *this,Float y)

{
  Float *pFVar1;
  double dVar2;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  bool bVar6;
  FloatPoint to_00;
  FloatPoint from;
  Float FStack_50;
  FloatPoint newPoint;
  Float local_38;
  Float FStack_30;
  FloatPoint to;
  Float x;
  Float y_local;
  Segment *this_local;
  
  if ((this->to).y <= (this->from).y) {
    __assert_fail("this->from.y < this->to.y",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                  ,0x62,"const Segment gepard::Segment::splitSegment(const Float)");
  }
  pFVar1 = &(this->from).y;
  bVar6 = false;
  if (*pFVar1 <= y && y != *pFVar1) {
    bVar6 = y < (this->to).y;
  }
  if (!bVar6) {
    __assert_fail("y > this->from.y && y < this->to.y",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                  ,99,"const Segment gepard::Segment::splitSegment(const Float)");
  }
  FVar5 = slopeInv(this);
  FVar3 = (this->to).x;
  FVar4 = (this->to).y;
  FloatPoint::FloatPoint((FloatPoint *)&newPoint.y,FVar5 * (y - (this->from).y) + (this->from).x,y);
  (this->to).x = newPoint.y;
  (this->to).y = local_38;
  FStack_50 = (this->to).x;
  newPoint.x = (this->to).y;
  FStack_30 = FVar3;
  to.x = FVar4;
  if (this->direction == -1) {
    FStack_30 = (this->to).x;
    to.x = (this->to).y;
    FStack_50 = FVar3;
    newPoint.x = FVar4;
  }
  dVar2 = (this->from).y;
  if ((dVar2 == newPoint.x) && (!NAN(dVar2) && !NAN(newPoint.x))) {
    __assert_fail("this->from.y != newPoint.y",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                  ,0x6f,"const Segment gepard::Segment::splitSegment(const Float)");
  }
  if ((newPoint.x == to.x) && (!NAN(newPoint.x) && !NAN(to.x))) {
    __assert_fail("newPoint.y != to.y",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                  ,0x70,"const Segment gepard::Segment::splitSegment(const Float)");
  }
  from.y = newPoint.x;
  from.x = FStack_50;
  to_00.y = to.x;
  to_00.x = FStack_30;
  Segment(__return_storage_ptr__,from,to_00,(uint)(long)this->id,this->realSlope);
  return __return_storage_ptr__;
}

Assistant:

const Segment Segment::splitSegment(const Float y)
{
    GD_ASSERT(this->from.y < this->to.y);
    GD_ASSERT(y > this->from.y && y < this->to.y);

    const Float x = this->slopeInv() * (y - this->from.y) + this->from.x;
    FloatPoint to = this->to;
    this->to = FloatPoint(x, y);
    FloatPoint newPoint = this->to;

    if (this->direction == Negative) {
        newPoint = to;
        to = this->to;
    }

    GD_ASSERT(this->from.y != newPoint.y);
    GD_ASSERT(newPoint.y != to.y);

    return Segment(newPoint, to, this->id, this->realSlope);
}